

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.h
# Opt level: O0

string * __thiscall
CoreML::Specification::CategoricalMapping::mutable_strvalue_abi_cxx11_(CategoricalMapping *this)

{
  bool bVar1;
  string *psVar2;
  CategoricalMapping *this_local;
  
  bVar1 = has_strvalue(this);
  if (!bVar1) {
    clear_ValueOnUnknown(this);
    set_has_strvalue(this);
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
              (&(this->ValueOnUnknown_).strvalue_,psVar2);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  psVar2 = google::protobuf::internal::ArenaStringPtr::MutableNoArena
                     (&(this->ValueOnUnknown_).strvalue_,psVar2);
  return psVar2;
}

Assistant:

inline ::std::string* CategoricalMapping::mutable_strvalue() {
  if (!has_strvalue()) {
    clear_ValueOnUnknown();
    set_has_strvalue();
    ValueOnUnknown_.strvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.CategoricalMapping.strValue)
  return ValueOnUnknown_.strvalue_.MutableNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
}